

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3.hpp
# Opt level: O3

bool jsoncons::detail::grisu3(double v,char *buffer,int *length,int *K)

{
  long lVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  diy_fp_t Wm;
  diy_fp_t W;
  diy_fp_t Wp;
  
  uVar13 = (ulong)v & 0xfffffffffffff;
  uVar6 = (uint)((ulong)v >> 0x34) & 0x7ff;
  uVar17 = uVar13 | 0x10000000000000;
  uVar7 = uVar17;
  if (uVar6 == 0) {
    uVar7 = uVar13;
  }
  iVar8 = uVar6 - 0x433;
  iVar5 = -0x432;
  if (uVar6 != 0) {
    iVar5 = iVar8;
  }
  iVar4 = iVar5 + -1;
  uVar15 = uVar7 * 2 + 1;
  iVar16 = iVar4;
  if (uVar6 == 0) {
    lVar11 = 0x3f;
    if ((uVar15 & 0x1fffffffffffff) != 0) {
      for (; (uVar15 & 0x1fffffffffffff) >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    uVar15 = uVar15 << (~(byte)lVar11 + 0x36 & 0x3f);
    lVar1 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar17 = uVar13 << (~(byte)lVar1 + 0x35 & 0x3f);
    iVar8 = ((uint)lVar1 ^ 0xffffffc0) - 0x426;
    iVar16 = ((uint)lVar11 ^ 0xffffffc0) - 0x428;
  }
  lVar11 = uVar7 * 2 + -1;
  if (uVar7 == 0x10000000000000) {
    iVar4 = iVar5 + -2;
    lVar11 = 0x3fffffffffffff;
  }
  uVar9 = lVar11 << (((char)iVar4 - (char)iVar16) + 10U & 0x3f);
  dVar2 = ceil((double)(-0x32 - iVar16) * 0.30102999566398114);
  iVar5 = (int)dVar2;
  uVar7 = (uVar17 << 0xb) >> 0x20;
  uVar17 = uVar17 << 0xb & 0xffffffff;
  uVar10 = *(ulong *)(powers_ten + (long)iVar5 * 8 + 0xab8) & 0xffffffff;
  uVar14 = *(ulong *)(powers_ten + (long)iVar5 * 8 + 0xab8) >> 0x20;
  uVar12 = uVar14 * uVar17;
  uVar13 = uVar7 * uVar10;
  W.f = ((uVar12 & 0xffffffff) + (uVar13 & 0xffffffff) + (uVar17 * uVar10 >> 0x20) + 0x80000000 >>
        0x20) + (uVar12 >> 0x20) + (uVar13 >> 0x20) + uVar14 * uVar7;
  W.e = iVar8 + *(int *)(powers_ten_e + (long)iVar5 * 4 + 0x55c) + 0x35;
  uVar13 = (uVar15 << 10) >> 0x20;
  uVar7 = uVar15 << 10 & 0xffffffff;
  uVar15 = uVar14 * uVar7;
  uVar17 = uVar13 * uVar10;
  Wp.f = ((uVar15 & 0xffffffff) + (uVar17 & 0xffffffff) + (uVar7 * uVar10 >> 0x20) + 0x80000000 >>
         0x20) + (uVar15 >> 0x20) + (uVar17 >> 0x20) + uVar14 * uVar13;
  Wm.e = *(int *)(powers_ten_e + (long)iVar5 * 4 + 0x55c) + iVar16 + 0x36;
  uVar13 = uVar9 >> 0x20;
  uVar9 = uVar9 & 0xffffffff;
  uVar7 = uVar14 * uVar9;
  uVar17 = uVar13 * uVar10;
  Wm.f = ((uVar7 & 0xffffffff) + (uVar17 & 0xffffffff) + (uVar10 * uVar9 >> 0x20) + 0x80000000 >>
         0x20) + (uVar7 >> 0x20) + (uVar17 >> 0x20) + uVar14 * uVar13;
  *K = -iVar5;
  Wm._12_4_ = 0;
  W._12_4_ = 0;
  Wp.e = Wm.e;
  Wp._12_4_ = 0;
  bVar3 = digit_gen(Wm,W,Wp,buffer,length,K);
  buffer[*length] = '\0';
  return bVar3;
}

Assistant:

inline
bool grisu3(double v, char *buffer, int *length, int *K)
{
    diy_fp_t w_m, w_p;
    int q = 64, alpha = -59, gamma = -56;
    normalized_boundaries(v, &w_m, &w_p);
    diy_fp_t w = normalize_diy_fp(double2diy_fp(v));
    int mk = k_comp(w_p.e + q, alpha, gamma);
    diy_fp_t c_mk = cached_power(mk);
    diy_fp_t W  = multiply(w,   c_mk);
    diy_fp_t Wp = multiply(w_p, c_mk);
    diy_fp_t Wm = multiply(w_m, c_mk);
    *K = -mk;
    bool result = digit_gen(Wm, W, Wp, buffer, length, K);
    buffer[*length] = 0;
    return result;
}